

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

string * __thiscall
wasm::Pass::getArgument
          (string *__return_storage_ptr__,Pass *this,string *key,string *errorTextIfMissing)

{
  PassRunner *pPVar1;
  bool bVar2;
  __type_conflict _Var3;
  Fatal local_1f0;
  string local_68;
  string local_48;
  
  bVar2 = hasArgument(this,key);
  if (bVar2) {
    _Var3 = std::operator==(key,&this->name);
    if (_Var3) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->passArg);
    }
    else {
      pPVar1 = this->runner;
      std::__cxx11::string::string((string *)&local_68,(string *)key);
      std::__cxx11::string::string((string *)&local_48,(string *)errorTextIfMissing);
      PassOptions::getArgument(__return_storage_ptr__,&pPVar1->options,&local_68,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
    return __return_storage_ptr__;
  }
  Fatal::Fatal(&local_1f0);
  Fatal::operator<<(&local_1f0,errorTextIfMissing);
  Fatal::~Fatal(&local_1f0);
}

Assistant:

std::string Pass::getArgument(const std::string& key,
                              const std::string& errorTextIfMissing) {
  if (!hasArgument(key)) {
    Fatal() << errorTextIfMissing;
  }

  return (key == name) ? *passArg
                       : getPassOptions().getArgument(key, errorTextIfMissing);
}